

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

char_type * __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as_cstring
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  uint uVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  char_type *pcVar2;
  string local_38;
  
  while( true ) {
    uVar1 = (byte)((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                    *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>
                  )->json_ref_ & 0xf;
    if (1 < uVar1 - 8) break;
    this = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
           (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
              *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
           byte_str_).ptr_;
  }
  if (uVar1 == 0xf) {
    pcVar2 = *(char_type **)
              (*(long *)&(((pointer)this)->
                         super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 + 8
              );
  }
  else {
    if (uVar1 != 7) {
      this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Not a cstring","");
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_38);
      __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    pcVar2 = (char_type *)
             ((long)&(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)
                     .extra_ + 2);
  }
  return pcVar2;
}

Assistant:

const char_type* as_cstring() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                    return cast<short_string_storage>().c_str();
                case json_storage_kind::long_str:
                    return cast<long_string_storage>().c_str();
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_cstring();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_cstring();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a cstring"));
            }
        }